

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O1

bool __thiscall
libtorrent::aux::utp_socket_impl::incoming_packet
          (utp_socket_impl *this,span<const_char> b,endpoint *ep,time_point receive_time)

{
  be_uint16 *ptr;
  byte bVar1;
  uint8_t uVar2;
  uint16_t uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  char cVar6;
  short sVar7;
  ushort uVar8;
  uint16_t uVar9;
  uint uVar10;
  uint32_t uVar12;
  int iVar13;
  uint *__result;
  pair<unsigned_int,_int> pVar14;
  packet *p_00;
  ulong uVar15;
  array<unsigned_int,_3UL> *paVar16;
  in_addr_t iVar17;
  long lVar18;
  utp_header *ptr_00;
  utp_header *puVar19;
  uint32_t sample;
  long lVar20;
  uint8_t uVar21;
  undefined8 uVar22;
  _Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
  _Var23;
  uint ret;
  uint sample_00;
  ushort uVar24;
  state_t s;
  utp_header *ph;
  long lVar25;
  utp_socket_manager *this_00;
  time_point tVar26;
  bool bVar27;
  packet_ptr p;
  uint32_t local_8c;
  ulong local_80;
  undefined1 local_78 [8];
  error_category *peStack_70;
  long local_68;
  _Head_base<0UL,_libtorrent::aux::packet_*,_false> local_60;
  int32_t local_58;
  uint32_t local_54;
  time_point local_50;
  long local_48;
  endpoint *local_40;
  packet_buffer *local_38;
  int iVar11;
  
  lVar25 = b.m_len;
  ph = (utp_header *)b.m_ptr;
  utp_socket_manager::inc_stats_counter(this->m_sm,0xa5,1);
  if ((lVar25 < 0x14) || (bVar1 = ph->type_ver, (bVar1 & 0xf) != 1)) {
LAB_0039cd32:
    utp_socket_manager::inc_stats_counter(this->m_sm,0xad,1);
    return false;
  }
  if ((bVar1 & 0xf0) != 0x40) {
    lVar20 = 0;
    uVar8 = 0;
    do {
      uVar8 = (ushort)(byte)(ph->connection_id).m_storage[lVar20] | uVar8 << 8;
      lVar20 = lVar20 + 1;
    } while ((int)lVar20 == 1);
    if (uVar8 != this->m_recv_id) goto LAB_0039cd32;
  }
  if (0x4f < bVar1) goto LAB_0039cd32;
  uVar8 = *(ushort *)&this->field_0x21c;
  if ((uVar8 & 0x1c) == 0 && (bVar1 & 0xf0) == 0x40) {
    bVar27 = (ep->impl_).data_.base.sa_family != 2;
    if (bVar27) {
      local_78 = *(undefined1 (*) [8])
                  &((__uniq_ptr_impl<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
                     *)((long)&(ep->impl_).data_ + 8))->_M_t;
      peStack_70 = *(error_category **)((long)&(ep->impl_).data_ + 0x10);
      uVar15 = (ulong)(ep->impl_).data_.v6.sin6_scope_id;
      iVar17 = 0;
    }
    else {
      iVar17 = (ep->impl_).data_.v4.sin_addr.s_addr;
      local_78 = (undefined1  [8])0x0;
      peStack_70 = (error_category *)0x0;
      uVar15 = 0;
    }
    (this->m_remote_address).type_ = (uint)bVar27;
    (this->m_remote_address).ipv4_address_.addr_.s_addr = iVar17;
    *(undefined1 (*) [8])&(this->m_remote_address).ipv6_address_.addr_.__in6_u = local_78;
    *(error_category **)((long)&(this->m_remote_address).ipv6_address_.addr_.__in6_u + 8) =
         peStack_70;
    (this->m_remote_address).ipv6_address_.scope_id_ = uVar15;
    uVar24 = (ep->impl_).data_.v4.sin_port;
    this->m_port = uVar24 << 8 | uVar24 >> 8;
  }
  if (((uVar8 & 0x1c) != 0) && ((ph->type_ver & 0xf0) == 0x40)) {
LAB_0039cddf:
    this_00 = this->m_sm;
    iVar13 = 0xad;
    goto LAB_0039d166;
  }
  lVar20 = (long)receive_time.__d.__r - (this->m_last_history_step).__d.__r;
  if (60000000000 < lVar20) {
    (this->m_last_history_step).__d.__r = (rep)receive_time.__d.__r;
  }
  uVar10 = 0;
  lVar18 = 4;
  do {
    uVar10 = (uint)(&((utp_header *)(&ph->connection_id + -1))->type_ver)[lVar18] | uVar10 << 8;
    lVar18 = lVar18 + 1;
  } while ((int)lVar18 != 8);
  if (uVar10 == 0) {
    local_54 = 0;
  }
  else {
    lVar18 = 0;
    uVar10 = 0;
    do {
      uVar10 = (uint)(byte)(ph->timestamp_microseconds).m_storage[lVar18] | uVar10 << 8;
      lVar18 = lVar18 + 1;
    } while ((int)lVar18 != 4);
    sample = (int)((long)receive_time.__d.__r / 1000) - uVar10;
    this->m_reply_micro = sample;
    uVar12 = 0;
    if ((this->m_their_delay_hist).m_num_samples != 0xffff) {
      uVar12 = (this->m_their_delay_hist).m_base;
    }
    local_54 = timestamp_history::add_sample(&this->m_their_delay_hist,sample,60000000000 < lVar20);
    if (((uVar12 != 0) && (uVar10 = (this->m_their_delay_hist).m_base - uVar12, 0xffffd8f0 < uVar10)
        ) && ((this->m_delay_hist).m_num_samples != 0xffff)) {
      timestamp_history::adjust_base(&this->m_delay_hist,-uVar10);
    }
  }
  bVar1 = ph->type_ver >> 4;
  uVar10 = *(uint *)&this->field_0x21c >> 2 & 7;
  sVar7 = (short)uVar10;
  if ((uVar10 | 2) == 3) {
    if (bVar1 - 1 < 2) goto LAB_0039cf3c;
LAB_0039cf46:
    uVar9 = this->m_seq_nr - 1;
  }
  else {
    if (((byte)(bVar1 - 3) < 0xfe) || (sVar7 != 5)) goto LAB_0039cf46;
LAB_0039cf3c:
    uVar9 = this->m_seq_nr;
  }
  local_48 = lVar25;
  if (sVar7 != 0 || bVar1 != 4) {
    lVar25 = 0;
    uVar8 = 0;
    do {
      uVar8 = uVar8 << 8 | (ushort)(byte)(ph->ack_nr).m_storage[lVar25];
      lVar25 = lVar25 + 1;
    } while ((int)lVar25 == 1);
    if ((ushort)(uVar9 - uVar8) <= (ushort)(uVar8 - uVar9)) {
      lVar25 = 0;
      uVar8 = 0;
      do {
        uVar8 = uVar8 << 8 | (ushort)(byte)(ph->ack_nr).m_storage[lVar25];
        lVar25 = lVar25 + 1;
      } while ((int)lVar25 == 1);
      sVar7 = this->m_acked_seq_nr - 3;
      if ((ushort)(uVar8 - sVar7) <= (ushort)(sVar7 - uVar8)) goto LAB_0039cf68;
    }
LAB_0039d15d:
    this_00 = this->m_sm;
    iVar13 = 0xae;
LAB_0039d166:
    utp_socket_manager::inc_stats_counter(this_00,iVar13,1);
    return true;
  }
LAB_0039cf68:
  if ((*(uint *)&this->field_0x21c & 0x20) != 0) {
    uVar3 = this->m_in_eof_seq_nr;
    lVar25 = 0;
    uVar8 = 0;
    do {
      uVar8 = uVar8 << 8 | (ushort)(byte)(ph->seq_nr).m_storage[lVar25];
      lVar25 = lVar25 + 1;
    } while ((int)lVar25 == 1);
    if ((ushort)(uVar8 - uVar3) < (ushort)(uVar3 - uVar8)) {
      lVar25 = 0;
      uVar8 = 0;
      do {
        uVar8 = (ushort)(byte)(ph->seq_nr).m_storage[lVar25] | uVar8 << 8;
        lVar25 = lVar25 + 1;
      } while ((int)lVar25 == 1);
      if ((byte)(bVar1 - 3) < 0xfe) {
        return true;
      }
      if (uVar3 != uVar8) {
        return true;
      }
    }
  }
  local_50.__d.__r = receive_time.__d.__r;
  local_40 = ep;
  if (ph->type_ver < 0x10) {
    utp_socket_manager::inc_stats_counter(this->m_sm,0xab,1);
  }
  if ((this->field_0x21c & 0x18) != 0) {
    iVar13 = this->m_receive_buffer_capacity / 0x44c;
    iVar11 = 0x10;
    if (0x10 < iVar13) {
      iVar11 = iVar13;
    }
    sVar7 = (short)iVar11 + this->m_ack_nr;
    lVar25 = 0;
    uVar8 = 0;
    do {
      uVar8 = uVar8 << 8 | (ushort)(byte)(ph->seq_nr).m_storage[lVar25];
      lVar25 = lVar25 + 1;
    } while ((int)lVar25 == 1);
    if ((ushort)(uVar8 - sVar7) < (ushort)(sVar7 - uVar8)) goto LAB_0039d15d;
  }
  if ((ph->type_ver & 0xf0) == 0x30) {
    lVar25 = 0;
    uVar8 = 0;
    do {
      uVar8 = uVar8 << 8 | (ushort)(byte)(ph->ack_nr).m_storage[lVar25];
      lVar25 = lVar25 + 1;
    } while ((int)lVar25 == 1);
    if ((ushort)(uVar8 - uVar9) < (ushort)(uVar9 - uVar8)) {
      return true;
    }
    (this->m_error).val_ = 0x68;
    (this->m_error).failed_ = true;
    *(undefined3 *)&(this->m_error).field_0x5 = 0;
    (this->m_error).cat_ =
         &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
    set_state(this,error_wait);
    goto LAB_0039d0d9;
  }
  this->m_in_packets = this->m_in_packets + 1;
  uVar10 = 0;
  lVar25 = 8;
  do {
    uVar10 = (uint)(&((utp_header *)(&ph->connection_id + -1))->type_ver)[lVar25] | uVar10 << 8;
    lVar25 = lVar25 + 1;
  } while ((int)lVar25 != 0xc);
  sample_00 = 0;
  if (uVar10 != 0x7fffffff) {
    lVar25 = 0;
    sample_00 = 0;
    do {
      sample_00 = sample_00 << 8 |
                  (uint)(byte)(ph->timestamp_difference_microseconds).m_storage[lVar25];
      lVar25 = lVar25 + 1;
    } while ((int)lVar25 != 4);
  }
  if (sample_00 != 0) {
    uVar12 = timestamp_history::add_sample(&this->m_delay_hist,sample_00,60000000000 < lVar20);
    uVar8 = *(ushort *)&this->field_0x21c;
    uVar24 = uVar8 + 1 & 3;
    *(ushort *)&this->field_0x21c = uVar24 | uVar8 & 0xfffc;
    (this->m_delay_sample_hist)._M_elems[uVar8 & 3] = uVar12;
    if (uVar24 == 3) {
      *(ushort *)&this->field_0x21c = uVar8 & 0xfffc;
    }
  }
  local_58 = this->m_bytes_in_flight;
  uVar10 = 0;
  lVar25 = 0xc;
  do {
    uVar10 = (uint)(&((utp_header *)(&ph->connection_id + -1))->type_ver)[lVar25] | uVar10 << 8;
    lVar25 = lVar25 + 1;
  } while ((int)lVar25 != 0x10);
  this->m_adv_wnd = uVar10;
  lVar25 = 0x12;
  uVar8 = 0;
  do {
    uVar8 = (ushort)(&((utp_header *)(&ph->connection_id + -1))->type_ver)[lVar25] | uVar8 << 8;
    lVar25 = lVar25 + 1;
  } while ((int)lVar25 == 0x13);
  uVar24 = this->m_acked_seq_nr;
  if (((uVar8 == uVar24) && ((this->m_outbuf).m_size != 0)) && ((ph->type_ver & 0xf0) == 0x20)) {
    this->m_duplicate_acks = this->m_duplicate_acks + '\x01';
  }
  if ((this->field_0x21c & 0x1c) == 0) {
LAB_0039d2f7:
    local_8c = 0xffffffff;
    local_80 = 0;
  }
  else {
    lVar25 = 0;
    uVar8 = 0;
    do {
      uVar8 = uVar8 << 8 | (ushort)(byte)(ph->ack_nr).m_storage[lVar25];
      lVar25 = lVar25 + 1;
    } while ((int)lVar25 == 1);
    if ((ushort)(uVar24 - uVar8) <= (ushort)(uVar8 - uVar24)) goto LAB_0039d2f7;
    lVar25 = 0;
    uVar8 = 0;
    do {
      uVar8 = (ushort)(byte)(ph->ack_nr).m_storage[lVar25] | uVar8 << 8;
      lVar25 = lVar25 + 1;
    } while ((int)lVar25 == 1);
    if (uVar24 == uVar8) {
      local_8c = 0xffffffff;
      local_80 = 0;
    }
    else {
      uVar9 = uVar24 + 1;
      local_38 = &this->m_outbuf;
      local_80 = 0;
      local_8c = 0xffffffff;
      do {
        if (uVar9 == this->m_fast_resend_seq_nr) {
          this->m_fast_resend_seq_nr = this->m_fast_resend_seq_nr + 1;
        }
        packet_buffer::remove((packet_buffer *)local_78,(char *)local_38);
        if ((_Tuple_impl<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
             )local_78 !=
            (unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)0x0) {
          uVar24 = *(ushort *)((long)local_78 + 10);
          local_68 = CONCAT44(local_68._4_4_,(uint)*(ushort *)((long)local_78 + 0xc));
          local_60._M_head_impl = (packet *)local_78;
          local_78 = (undefined1  [8])0x0;
          uVar12 = ack_packet(this,(packet_ptr *)&local_60,local_50,uVar9);
          if (local_60._M_head_impl != (packet *)0x0) {
            free(local_60._M_head_impl);
          }
          local_80 = (ulong)(((int)local_80 + (uint)uVar24) - (index_type)local_68);
          local_60._M_head_impl = (packet *)0x0;
          if (uVar12 < local_8c) {
            local_8c = uVar12;
          }
        }
        if (local_78 != (undefined1  [8])0x0) {
          free((void *)local_78);
        }
        uVar9 = uVar9 + 1;
      } while ((ushort)(uVar8 + 1) != uVar9);
    }
    maybe_inc_acked_seq_nr(this);
    if ((this->m_outbuf).m_size == 0) {
      this->m_duplicate_acks = '\0';
    }
  }
  ptr_00 = ph + 1;
  uVar21 = ph->extension;
  lVar25 = (long)(int)local_48;
  local_68 = lVar25;
  while (uVar21 != '\0') {
    if (lVar25 < (long)((long)ptr_00 + (2 - (long)ph))) goto LAB_0039cddf;
    ptr = &ptr_00->connection_id;
    bVar1 = ptr_00->extension;
    lVar20 = (long)ptr + ((ulong)bVar1 - (long)ph);
    if (lVar25 < lVar20) {
      utp_socket_manager::inc_stats_counter(this->m_sm,0xad,1);
      lVar25 = local_68;
      ptr_00 = (utp_header *)ptr;
    }
    else {
      uVar2 = ptr_00->type_ver;
      if (uVar21 == '\x03') {
        parse_close_reason(this,(uint8_t *)ptr,(uint)bVar1);
        lVar25 = local_68;
      }
      else if (uVar21 == '\x01') {
        lVar25 = 0;
        uVar8 = 0;
        do {
          uVar8 = (ushort)(byte)(ph->ack_nr).m_storage[lVar25] | uVar8 << 8;
          lVar25 = lVar25 + 1;
        } while ((int)lVar25 == 1);
        pVar14 = parse_sack(this,uVar8,(uint8_t *)ptr,(uint)bVar1,local_50);
        local_80 = (ulong)pVar14 >> 0x20;
        lVar25 = local_68;
        if (pVar14.first <= local_8c) {
          local_8c = pVar14.first;
        }
      }
      ptr_00 = (utp_header *)(ptr->m_storage + bVar1);
      uVar21 = uVar2;
    }
    if (lVar25 < lVar20) {
      return true;
    }
  }
  this->m_num_timeouts = '\0';
  puVar19 = ptr_00;
  iVar13 = packet_timeout(this);
  tVar26.__d.__r = local_50.__d.__r;
  (this->m_timeout).__d.__r = (long)iVar13 * 1000000 + (long)local_50.__d.__r;
  if ((2 < this->m_duplicate_acks) &&
     (uVar4 = this->m_acked_seq_nr, (ushort)(uVar4 + 1) == this->m_fast_resend_seq_nr)) {
    p_00 = packet_buffer::at(&this->m_outbuf,(uint)this->m_fast_resend_seq_nr);
    uVar8 = this->m_fast_resend_seq_nr + 1;
    this->m_fast_resend_seq_nr = uVar8;
    if (p_00 != (packet *)0x0) {
      if (-1 < (char)p_00->field_0xe) {
        experienced_loss(this,(uint)uVar8,tVar26);
      }
      resend_packet(this,p_00,true);
    }
  }
  iVar13 = ((int)b.m_ptr - (int)ptr_00) + (int)local_48;
  uVar15 = CONCAT71((int7)((ulong)puVar19 >> 8),ph->type_ver) & 0xffffffff;
  tVar26.__d.__r._1_7_ = (undefined7)(uVar15 >> 8);
  tVar26.__d.__r._0_1_ = (byte)uVar15 >> 4;
  if ((byte)tVar26.__d.__r == 1) {
    lVar25 = 0;
    uVar8 = 0;
    do {
      uVar8 = (ushort)(byte)(ph->seq_nr).m_storage[lVar25] | uVar8 << 8;
      lVar25 = lVar25 + 1;
    } while ((int)lVar25 == 1);
    uVar5 = this->m_ack_nr;
    if (uVar8 != (ushort)(uVar5 + 1)) {
      lVar25 = 0;
      uVar8 = 0;
      do {
        uVar8 = (ushort)(byte)(ph->seq_nr).m_storage[lVar25] | uVar8 << 8;
        lVar25 = lVar25 + 1;
      } while ((int)lVar25 == 1);
      if (uVar8 != uVar5) goto LAB_0039d633;
    }
    lVar25 = 0;
    uVar8 = 0;
    do {
      uVar8 = (ushort)(byte)(ph->seq_nr).m_storage[lVar25] | uVar8 << 8;
      lVar25 = lVar25 + 1;
    } while ((int)lVar25 == 1);
    this->m_ack_nr = uVar8;
LAB_0039d633:
    if ((*(ushort *)&this->field_0x21c & 0x20) == 0) {
      *(ushort *)&this->field_0x21c = *(ushort *)&this->field_0x21c | 0x20;
      lVar25 = 0;
      if (iVar13 < 1) {
        uVar8 = 0;
        do {
          uVar8 = (ushort)(byte)(ph->seq_nr).m_storage[lVar25] | uVar8 << 8;
          lVar25 = lVar25 + 1;
        } while ((int)lVar25 == 1);
      }
      else {
        uVar8 = 0;
        do {
          uVar8 = (ushort)(byte)(ph->seq_nr).m_storage[lVar25] | uVar8 << 8;
          lVar25 = lVar25 + 1;
        } while ((int)lVar25 == 1);
        uVar8 = uVar8 + 1;
      }
      this->m_in_eof_seq_nr = uVar8;
    }
    if ((*(uint *)&this->field_0x21c >> 0xc & 1) == 0) {
      *(ushort *)&this->field_0x21c = (ushort)*(uint *)&this->field_0x21c | 0x1000;
      utp_socket_manager::defer_ack(this->m_sm,this);
    }
    if (this->m_ack_nr == this->m_in_eof_seq_nr) {
      if ((this->m_receive_buffer).
          super__Vector_base<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::allocator<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this->m_receive_buffer).
          super__Vector_base<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::allocator<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        _Var23._M_head_impl =
             (unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)0x100000002;
        if (((DAT_004fcee8 != -0x70502de1da3a1f65) && (DAT_004fcee8 != -0x4d54ee85da8120f3)) &&
           (cVar6 = (**(code **)(boost::asio::error::get_misc_category()::instance + 0x30))
                              (&boost::asio::error::get_misc_category()::instance,2), cVar6 == '\0')
           ) {
          _Var23._M_head_impl =
               (unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)0x2;
        }
        peStack_70 = (error_category *)&boost::asio::error::get_misc_category()::instance;
        local_78 = (undefined1  [8])_Var23._M_head_impl;
        maybe_trigger_receive_callback(this,(error_code *)local_78);
        return true;
      }
      return true;
    }
    return true;
  }
  uVar10 = *(uint *)&this->field_0x21c;
  switch(uVar10 >> 2 & 7) {
  case 0:
    if ((byte)tVar26.__d.__r != 4) {
      return true;
    }
    set_state(this,connected);
    bVar27 = (local_40->impl_).data_.base.sa_family != 2;
    if (bVar27) {
      local_78 = *(undefined1 (*) [8])
                  &((__uniq_ptr_impl<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
                     *)((long)&(local_40->impl_).data_ + 8))->_M_t;
      peStack_70 = *(error_category **)((long)&(local_40->impl_).data_ + 0x10);
      uVar15 = (ulong)(local_40->impl_).data_.v6.sin6_scope_id;
      iVar17 = 0;
    }
    else {
      iVar17 = (local_40->impl_).data_.v4.sin_addr.s_addr;
      local_78 = (undefined1  [8])0x0;
      peStack_70 = (error_category *)0x0;
      uVar15 = 0;
    }
    (this->m_remote_address).type_ = (uint)bVar27;
    (this->m_remote_address).ipv4_address_.addr_.s_addr = iVar17;
    *(undefined1 (*) [8])&(this->m_remote_address).ipv6_address_.addr_.__in6_u = local_78;
    *(error_category **)((long)&(this->m_remote_address).ipv6_address_.addr_.__in6_u + 8) =
         peStack_70;
    (this->m_remote_address).ipv6_address_.scope_id_ = uVar15;
    uVar8 = (local_40->impl_).data_.v4.sin_port;
    this->m_port = uVar8 << 8 | uVar8 >> 8;
    lVar25 = 0;
    uVar8 = 0;
    do {
      uVar8 = (ushort)(byte)(ph->seq_nr).m_storage[lVar25] | uVar8 << 8;
      lVar25 = lVar25 + 1;
    } while ((int)lVar25 == 1);
    this->m_ack_nr = uVar8;
    lVar25 = random((aux *)0xffff);
    uVar9 = (uint16_t)lVar25;
    this->m_seq_nr = uVar9;
    this->m_acked_seq_nr = uVar9 - 1;
    this->m_loss_seq_nr = uVar9 - 1;
    this->m_fast_resend_seq_nr = uVar9;
    lVar25 = 0;
    uVar8 = 0;
    do {
      uVar8 = (ushort)(byte)(ph->connection_id).m_storage[lVar25] | uVar8 << 8;
      lVar25 = lVar25 + 1;
    } while ((int)lVar25 == 1);
    if (this->m_send_id != uVar8) {
      return false;
    }
    if ((*(uint *)&this->field_0x21c >> 0xc & 1) == 0) {
      *(ushort *)&this->field_0x21c = (ushort)*(uint *)&this->field_0x21c | 0x1000;
      utp_socket_manager::defer_ack(this->m_sm,this);
      return true;
    }
    return true;
  case 1:
    lVar25 = 0x12;
    uVar8 = 0;
    do {
      uVar8 = (ushort)(&((utp_header *)(&ph->connection_id + -1))->type_ver)[lVar25] | uVar8 << 8;
      lVar25 = lVar25 + 1;
    } while ((int)lVar25 == 0x13);
    if (uVar8 != (ushort)(this->m_seq_nr - 1)) {
      return true;
    }
    set_state(this,connected);
    if (ph->type_ver < 0x10) {
      lVar25 = 0;
      uVar8 = 0;
      do {
        uVar8 = (ushort)(byte)(ph->seq_nr).m_storage[lVar25] | uVar8 << 8;
        lVar25 = lVar25 + 1;
      } while ((int)lVar25 == 1);
    }
    else {
      lVar25 = 0;
      uVar8 = 0;
      do {
        uVar8 = (ushort)(byte)(ph->seq_nr).m_storage[lVar25] | uVar8 << 8;
        lVar25 = lVar25 + 1;
      } while ((int)lVar25 == 1);
      uVar8 = uVar8 - 1;
    }
    this->m_ack_nr = uVar8;
    if (this->m_connect_handler == true) {
      this->m_connect_handler = false;
      utp_stream::on_connect(this->m_userdata,&this->m_error,false);
    }
  case 2:
    if (local_58 != 0 && ((int)local_80 != 0 && sample_00 != 0)) {
      paVar16 = &this->m_delay_sample_hist;
      lVar25 = 0x1d8;
      do {
        if (*(uint *)((long)&(this->m_sock).
                             super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + lVar25) < paVar16->_M_elems[0]) {
          paVar16 = (array<unsigned_int,_3UL> *)
                    ((long)&(this->m_sock).
                            super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + lVar25);
        }
        lVar25 = lVar25 + 4;
      } while (lVar25 != 0x1e0);
      uVar10 = paVar16->_M_elems[0];
      if (local_8c <= paVar16->_M_elems[0]) {
        uVar10 = local_8c;
      }
      do_ledbat(this,(int)local_80,uVar10,local_58);
      this->m_send_delay = uVar10;
    }
    uVar12 = local_54;
    if (local_8c < local_54) {
      uVar12 = local_8c;
    }
    this->m_recv_delay = uVar12;
    consume_incoming_data(this,ph,&ptr_00->type_ver,iVar13,tVar26);
    bVar1 = ph->type_ver >> 4;
    if (bVar1 != 4) {
      this->field_0x21d = this->field_0x21d | 0x80;
    }
    uVar12 = this->m_out_packets;
    do {
      bVar27 = send_pkt(this,0);
    } while (bVar27);
    if ((((byte)(0x13 >> bVar1) & uVar12 == this->m_out_packets) == 1) &&
       ((*(uint *)&this->field_0x21c >> 0xc & 1) == 0)) {
      *(ushort *)&this->field_0x21c = (ushort)*(uint *)&this->field_0x21c | 0x1000;
      utp_socket_manager::defer_ack(this->m_sm,this);
    }
    if ((*(uint *)&this->field_0x21c >> 0xd & 1) == 0) {
      *(ushort *)&this->field_0x21c = (ushort)*(uint *)&this->field_0x21c | 0x2000;
      utp_socket_manager::subscribe_drained(this->m_sm,this);
      return true;
    }
    return true;
  case 3:
    if ((uVar10 >> 0xc & 1) == 0 && ph->type_ver < 0x10) {
      *(ushort *)&this->field_0x21c = (ushort)uVar10 | 0x1000;
      utp_socket_manager::defer_ack(this->m_sm,this);
    }
    bVar27 = consume_incoming_data(this,ph,&ptr_00->type_ver,iVar13,tVar26);
    if (bVar27) {
      return true;
    }
    if (this->m_acked_seq_nr != this->m_seq_nr) {
      return true;
    }
    uVar22 = 0x100000002;
    if ((this->field_0x21c & 0x80) == 0) {
      if (((DAT_004fcee8 != -0x70502de1da3a1f65) && (DAT_004fcee8 != -0x4d54ee85da8120f3)) &&
         (cVar6 = (**(code **)(boost::asio::error::get_misc_category()::instance + 0x30))
                            (&boost::asio::error::get_misc_category()::instance,2), cVar6 == '\0'))
      {
        uVar22 = 2;
      }
      (this->m_error).val_ = (int)uVar22;
      (this->m_error).failed_ = (bool)(char)((ulong)uVar22 >> 0x20);
      *(int3 *)&(this->m_error).field_0x5 = (int3)((ulong)uVar22 >> 0x28);
      (this->m_error).cat_ = (error_category *)&boost::asio::error::get_misc_category()::instance;
      s = deleting;
    }
    else {
      if (((DAT_004fcee8 != -0x70502de1da3a1f65) && (DAT_004fcee8 != -0x4d54ee85da8120f3)) &&
         (cVar6 = (**(code **)(boost::asio::error::get_misc_category()::instance + 0x30))
                            (&boost::asio::error::get_misc_category()::instance,2), cVar6 == '\0'))
      {
        uVar22 = 2;
      }
      (this->m_error).val_ = (int)uVar22;
      (this->m_error).failed_ = (bool)(char)((ulong)uVar22 >> 0x20);
      *(int3 *)&(this->m_error).field_0x5 = (int3)((ulong)uVar22 >> 0x28);
      (this->m_error).cat_ = (error_category *)&boost::asio::error::get_misc_category()::instance;
      s = error_wait;
    }
    set_state(this,s);
    break;
  default:
    return true;
  }
LAB_0039d0d9:
  test_socket_state(this);
  return true;
}

Assistant:

bool utp_socket_impl::incoming_packet(span<char const> b
	, udp::endpoint const& ep, time_point receive_time)
{
	INVARIANT_CHECK;
	span<std::uint8_t const> const buf(reinterpret_cast<std::uint8_t const*>(b.data()), b.size());

	auto const* ph = reinterpret_cast<utp_header const*>(buf.data());
	m_sm.inc_stats_counter(counters::utp_packets_in);

	if (buf.size() < int(sizeof(utp_header)))
	{
		UTP_LOG("%8p: ERROR: incoming packet size too small:%d (ignored)\n"
			, static_cast<void*>(this), int(buf.size()));
		m_sm.inc_stats_counter(counters::utp_invalid_pkts_in);
		return false;
	}

	if (ph->get_version() != 1)
	{
		UTP_LOG("%8p: ERROR: incoming packet version:%d (ignored)\n"
			, static_cast<void*>(this), int(ph->get_version()));
		m_sm.inc_stats_counter(counters::utp_invalid_pkts_in);
		return false;
	}

	// SYN packets have special (reverse) connection ids
	if (ph->get_type() != ST_SYN && ph->connection_id != m_recv_id)
	{
		UTP_LOG("%8p: ERROR: incoming packet id:%d expected:%d (ignored)\n"
			, static_cast<void*>(this), int(ph->connection_id), int(m_recv_id));
		m_sm.inc_stats_counter(counters::utp_invalid_pkts_in);
		return false;
	}

	if (ph->get_type() >= NUM_TYPES)
	{
		UTP_LOG("%8p: ERROR: incoming packet type:%d (ignored)\n"
			, static_cast<void*>(this), int(ph->get_type()));
		m_sm.inc_stats_counter(counters::utp_invalid_pkts_in);
		return false;
	}

	if (state() == state_t::none && ph->get_type() == ST_SYN)
	{
		m_remote_address = ep.address();
		m_port = ep.port();
	}

	if (state() != state_t::none && ph->get_type() == ST_SYN)
	{
		UTP_LOG("%8p: ERROR: incoming packet type:ST_SYN (ignored)\n"
			, static_cast<void*>(this));
		m_sm.inc_stats_counter(counters::utp_invalid_pkts_in);
		return true;
	}

	bool step = false;
	if (receive_time - m_last_history_step > minutes(1))
	{
		step = true;
		m_last_history_step = receive_time;
	}

	// this is the difference between their send time and our receive time
	// 0 means no sample yet
	std::uint32_t their_delay = 0;
	if (ph->timestamp_microseconds != 0)
	{
		auto timestamp = static_cast<std::uint32_t>(total_microseconds(
			receive_time.time_since_epoch()) & 0xffffffff);
		m_reply_micro = timestamp - ph->timestamp_microseconds;
		std::uint32_t const prev_base = m_their_delay_hist.initialized() ? m_their_delay_hist.base() : 0;
		their_delay = m_their_delay_hist.add_sample(m_reply_micro, step);
		int const base_change = int(m_their_delay_hist.base() - prev_base);
		UTP_LOGV("%8p: their_delay::add_sample:%u prev_base:%u new_base:%u\n"
			, static_cast<void*>(this), m_reply_micro, prev_base, m_their_delay_hist.base());

		if (prev_base && base_change < 0 && base_change > -10000 && m_delay_hist.initialized())
		{
			// their base delay went down. This is caused by clock drift. To compensate,
			// adjust our base delay upwards
			// don't adjust more than 10 ms. If the change is that big, something is probably wrong
			m_delay_hist.adjust_base(-base_change);
		}

		UTP_LOGV("%8p: incoming packet reply_micro:%u base_change:%d\n"
			, static_cast<void*>(this), m_reply_micro, prev_base ? base_change : 0);
	}

	bool const state_or_fin = ph->get_type() == ST_STATE
		|| ph->get_type() == ST_FIN;

	// is this ACK valid? If the other end is ACKing
	// a packet that hasn't been sent yet
	// just ignore it. A 3rd party could easily inject a packet
	// like this in a stream, don't sever it because of it.
	// since m_seq_nr is the sequence number of the next packet
	// we'll send (and m_seq_nr-1 was the last packet we sent),
	// if the ACK we got is greater than the last packet we sent
	// something is wrong.
	// If our state is state_none, this packet must be a syn packet
	// and the ack_nr should be ignored
	// Note that when we send a FIN, we don't increment m_seq_nr
	std::uint16_t const cmp_seq_nr =
		((state() == state_t::syn_sent
		  || state() == state_t::fin_sent
		  || state() == state_t::deleting)
			&& state_or_fin)
		? m_seq_nr : (m_seq_nr - 1) & ACK_MASK;

	if ((state() != state_t::none || ph->get_type() != ST_SYN)
		&& (compare_less_wrap(cmp_seq_nr, ph->ack_nr, ACK_MASK)
			|| compare_less_wrap(ph->ack_nr, m_acked_seq_nr
				- dup_ack_limit, ACK_MASK)))
	{
		UTP_LOG("%8p: ERROR: incoming packet ack_nr:%d our seq_nr:%d our "
			"acked_seq_nr:%d (ignored)\n"
			, static_cast<void*>(this), int(ph->ack_nr), m_seq_nr, m_acked_seq_nr);
		m_sm.inc_stats_counter(counters::utp_redundant_pkts_in);
		return true;
	}

	// if the socket is closing, always ignore any packet
	// with a higher sequence number than the FIN sequence number
	// ST_STATE messages always include the next seqnr, so it's acceptable to
	// receive the same seq_nr as the EOF as long as it's a STATE or FIN packet
	if (m_in_eof
		&& compare_less_wrap(m_in_eof_seq_nr, ph->seq_nr, ACK_MASK)
		&& !(m_in_eof_seq_nr == ph->seq_nr && state_or_fin))
	{
#if TORRENT_UTP_LOG
		UTP_LOG("%8p: ERROR: incoming payload after FIN type: %s seq_nr:%d eof_seq_nr:%d (ignored)\n"
			, static_cast<void*>(this), packet_type_names[ph->get_type()], int(ph->seq_nr), m_in_eof_seq_nr);
#endif
		return true;
	}

	if (ph->get_type() == ST_DATA)
		m_sm.inc_stats_counter(counters::utp_payload_pkts_in);

	// the number of packets that'll fit in the reorder buffer
	std::uint32_t const max_packets_reorder
		= static_cast<std::uint32_t>(std::max(16, m_receive_buffer_capacity / 1100));

	if (state() != state_t::none
		&& state() != state_t::syn_sent
		&& compare_less_wrap((m_ack_nr + max_packets_reorder) & ACK_MASK, ph->seq_nr, ACK_MASK))
	{
		// this is too far out to fit in our reorder buffer. Drop it
		// This is either an attack to try to break the connection
		// or a seriously damaged connection that lost a lot of
		// packets. Neither is very likely, and it should be OK
		// to drop the timestamp information.
		UTP_LOG("%8p: ERROR: incoming packet seq_nr:%d our ack_nr:%d (ignored)\n"
			, static_cast<void*>(this), int(ph->seq_nr), m_ack_nr);
		m_sm.inc_stats_counter(counters::utp_redundant_pkts_in);
		return true;
	}

	if (ph->get_type() == ST_RESET)
	{
		if (compare_less_wrap(cmp_seq_nr, ph->ack_nr, ACK_MASK))
		{
			UTP_LOG("%8p: ERROR: invalid RESET packet, ack_nr:%d our seq_nr:%d (ignored)\n"
				, static_cast<void*>(this), int(ph->ack_nr), m_seq_nr);
			return true;
		}
		UTP_LOGV("%8p: incoming packet type:RESET\n", static_cast<void*>(this));
		m_error = boost::asio::error::connection_reset;
		set_state(state_t::error_wait);
		test_socket_state();
		return true;
	}

	++m_in_packets;

	// the test for INT_MAX here is a work-around for a bug in uTorrent where
	// it's sometimes sent as INT_MAX when it is in fact uninitialized
	const std::uint32_t sample = ph->timestamp_difference_microseconds == INT_MAX
		? 0 : ph->timestamp_difference_microseconds;

	std::uint32_t delay = 0;
	if (sample != 0)
	{
		delay = m_delay_hist.add_sample(sample, step);
		m_delay_sample_hist[m_delay_sample_idx++] = delay;
		if (m_delay_sample_idx >= m_delay_sample_hist.size())
			m_delay_sample_idx = 0;
	}

	int acked_bytes = 0;

	TORRENT_ASSERT(m_bytes_in_flight >= 0);
	int prev_bytes_in_flight = m_bytes_in_flight;

	m_adv_wnd = ph->wnd_size;

	// if we get an ack for the same sequence number as
	// was last ACKed, and we have outstanding packets,
	// it counts as a duplicate ack. The reason to not count ST_DATA packets as
	// duplicate ACKs is because we may be receiving a stream of those
	// regardless of our outgoing traffic, which makes their ACK number not
	// indicative of a dropped packet
	if (ph->ack_nr == m_acked_seq_nr
		&& m_outbuf.size()
		&& ph->get_type() == ST_STATE)
	{
		++m_duplicate_acks;
	}

	TORRENT_ASSERT_VAL(m_outbuf.size() > 0 || m_duplicate_acks == 0, m_duplicate_acks);

	std::uint32_t min_rtt = std::numeric_limits<std::uint32_t>::max();

	TORRENT_ASSERT(m_outbuf.at((m_acked_seq_nr + 1) & ACK_MASK) || ((m_seq_nr - m_acked_seq_nr) & ACK_MASK) <= 1);

	// has this packet already been ACKed?
	// if the ACK we just got is less than the max ACKed
	// sequence number, it doesn't tell us anything.
	// So, only act on it if the ACK is greater than the last acked
	// sequence number
	if (state() != state_t::none && compare_less_wrap(m_acked_seq_nr, ph->ack_nr, ACK_MASK))
	{
		int const next_ack_nr = ph->ack_nr;

		for (int ack_nr = (m_acked_seq_nr + 1) & ACK_MASK;
			ack_nr != ((next_ack_nr + 1) & ACK_MASK);
			ack_nr = (ack_nr + 1) & ACK_MASK)
		{
			if (m_fast_resend_seq_nr == ack_nr)
				m_fast_resend_seq_nr = (m_fast_resend_seq_nr + 1) & ACK_MASK;
			packet_ptr p = m_outbuf.remove(aux::numeric_cast<packet_buffer::index_type>(ack_nr));

			if (!p) continue;

			acked_bytes += p->size - p->header_size;
			std::uint32_t const rtt = ack_packet(std::move(p), receive_time, std::uint16_t(ack_nr));
			min_rtt = std::min(min_rtt, rtt);
		}

		maybe_inc_acked_seq_nr();
		if (m_outbuf.empty()) m_duplicate_acks = 0;
	}

	// look for extended headers
	std::uint8_t const* ptr = buf.data();
	int const size = int(buf.size());
	ptr += sizeof(utp_header);

	std::uint8_t extension = ph->extension;
	while (extension)
	{
		// invalid packet. It says it has an extension header
		// but the packet is too short
		if (ptr - buf.data() + 2 > size)
		{
			UTP_LOG("%8p: ERROR: invalid extension header\n", static_cast<void*>(this));
			m_sm.inc_stats_counter(counters::utp_invalid_pkts_in);
			return true;
		}
		std::uint8_t const next_extension = *ptr++;
		int const len = *ptr++;
		if (ptr - buf.data() + len > size)
		{
			UTP_LOG("%8p: ERROR: invalid extension header size:%d packet:%d\n"
				, static_cast<void*>(this), len, int(ptr - buf.data()));
			m_sm.inc_stats_counter(counters::utp_invalid_pkts_in);
			return true;
		}
		switch(extension)
		{
			case utp_sack: // selective ACKs
			{
				std::uint32_t rtt;
				std::tie(rtt, acked_bytes) = parse_sack(ph->ack_nr, ptr, len, receive_time);
				min_rtt = std::min(min_rtt, rtt);
				break;
			}
			case utp_close_reason:
				parse_close_reason(ptr, len);
				break;
		}
		ptr += len;
		extension = next_extension;
	}

	// this is a valid incoming packet, update the timeout timer
	// do this after processing sacks/acks as that can effect packet_timeout()
	m_num_timeouts = 0;
	m_timeout = receive_time + milliseconds(packet_timeout());
	UTP_LOGV("%8p: updating timeout to: now + %d\n"
		, static_cast<void*>(this), packet_timeout());

	if (m_duplicate_acks >= dup_ack_limit
		&& ((m_acked_seq_nr + 1) & ACK_MASK) == m_fast_resend_seq_nr)
	{
		// LOSS

		UTP_LOGV("%8p: Packet %d lost. (%d duplicate acks, trigger fast-resend)\n"
			, static_cast<void*>(this), m_fast_resend_seq_nr, m_duplicate_acks);

		// resend the lost packet
		packet* p = m_outbuf.at(m_fast_resend_seq_nr);
		TORRENT_ASSERT(p);

		// don't fast-resend this again
		m_fast_resend_seq_nr = (m_fast_resend_seq_nr + 1) & ACK_MASK;

		if (p)
		{
			// don't consider a lost probe as proper loss, it doesn't necessarily
			// signal congestion
			if (!p->mtu_probe) experienced_loss(m_fast_resend_seq_nr, receive_time);
			resend_packet(p, true);
		}
	}

	// ptr points to the payload of the packet
	// size is the packet size, payload is the
	// number of payload bytes are in this packet
	const int header_size = int(ptr - buf.data());
	const int payload_size = size - header_size;

#if TORRENT_UTP_LOG
	UTP_LOGV("%8p: incoming packet seq_nr:%d ack_nr:%d type:%s id:%d size:%d timestampdiff:%u timestamp:%u "
			"our ack_nr:%d our seq_nr:%d our acked_seq_nr:%d our state:%s\n"
		, static_cast<void*>(this), int(ph->seq_nr), int(ph->ack_nr), packet_type_names[ph->get_type()]
		, int(ph->connection_id), payload_size, std::uint32_t(ph->timestamp_difference_microseconds)
		, std::uint32_t(ph->timestamp_microseconds), m_ack_nr, m_seq_nr, m_acked_seq_nr, socket_state_names[m_state]);
#endif

	if (ph->get_type() == ST_FIN)
	{
		// We ignore duplicate FIN packets, but we still need to ACK them.
		if (ph->seq_nr == ((m_ack_nr + 1) & ACK_MASK)
			|| ph->seq_nr == m_ack_nr)
		{
			UTP_LOGV("%8p: FIN received in order\n", static_cast<void*>(this));

			// The FIN arrived in order, nothing else is in the
			// reorder buffer.
			m_ack_nr = ph->seq_nr;
		}
		else
		{
			UTP_LOGV("%8p: FIN received out-of-order\n", static_cast<void*>(this));
		}

		if (payload_size > 0)
		{
			UTP_LOGV("%8p: FIN packet carries payload, which is not allowed (%d bytes)\n"
				, static_cast<void*>(this), payload_size);
		}

		if (m_in_eof)
		{
			UTP_LOGV("%8p: duplicate FIN packet (not updating, m_in_eof_seq_nr=%d)\n"
				, static_cast<void*>(this), m_in_eof_seq_nr);
		}
		else
		{
			m_in_eof = true;
			// even though invalid, tolerate FIN packets with payload
			if (payload_size > 0)
				m_in_eof_seq_nr = (ph->seq_nr + 1) & ACK_MASK;
			else
				m_in_eof_seq_nr = ph->seq_nr;
			UTP_LOGV("%8p: in_eof_seq_nr=%d m_receive_buffer=%d\n"
				, static_cast<void*>(this), m_in_eof_seq_nr, int(m_receive_buffer.size()));
		}

		defer_ack();

		if (m_ack_nr == m_in_eof_seq_nr && m_receive_buffer.empty())
			maybe_trigger_receive_callback(boost::asio::error::eof);
		return true;
	}

	// the send operation in parse_sack() may have set the socket to an error
	// state, in which case we shouldn't continue
	if (state() == state_t::error_wait || state() == state_t::deleting) return true;

	switch (state())
	{
		case state_t::none:
		{
			if (ph->get_type() == ST_SYN)
			{
				// if we're in state_none, the only thing
				// we accept are SYN packets.
				set_state(state_t::connected);

				m_remote_address = ep.address();
				m_port = ep.port();

				m_ack_nr = ph->seq_nr;
				m_seq_nr = std::uint16_t(random(0xffff));
				m_acked_seq_nr = (m_seq_nr - 1) & ACK_MASK;
				m_loss_seq_nr = m_acked_seq_nr;
				m_fast_resend_seq_nr = m_seq_nr;

#if TORRENT_UTP_LOG
				UTP_LOGV("%8p: received ST_SYN state:%s seq_nr:%d ack_nr:%d\n"
					, static_cast<void*>(this), socket_state_names[m_state], m_seq_nr, m_ack_nr);
#endif
				if (m_send_id != ph->connection_id)
				{
#if TORRENT_UTP_LOG
					UTP_LOGV("%8p: received invalid connection_id:%d expected: %d\n"
						, static_cast<void*>(this), int(ph->connection_id), int(m_send_id));
#endif
					return false;
				}
				TORRENT_ASSERT(m_recv_id == ((m_send_id + 1) & 0xffff));

				defer_ack();
			}
			else
			{
#if TORRENT_UTP_LOG
				UTP_LOG("%8p: ERROR: type:%s state:%s (ignored)\n"
					, static_cast<void*>(this), packet_type_names[ph->get_type()], socket_state_names[m_state]);
#endif
			}
			break;
		}
		case state_t::syn_sent:
		{
			// just wait for an ack to our SYN, ignore everything else
			if (ph->ack_nr != ((m_seq_nr - 1) & ACK_MASK))
			{
#if TORRENT_UTP_LOG
				UTP_LOGV("%8p: incorrect ack_nr (%d) waiting for %d\n"
					, static_cast<void*>(this), int(ph->ack_nr), (m_seq_nr - 1) & ACK_MASK);
#endif
				break;
			}

			TORRENT_ASSERT(!m_error);
			set_state(state_t::connected);
#if TORRENT_UTP_LOG
			UTP_LOGV("%8p: state:%s\n", static_cast<void*>(this), socket_state_names[m_state]);
#endif

			// only progress our ack_nr on ST_DATA messages
			// since our m_ack_nr is uninitialized at this point
			// we still need to set it to something regardless
			if (ph->get_type() == ST_DATA)
				m_ack_nr = ph->seq_nr;
			else
				m_ack_nr = (ph->seq_nr - 1) & ACK_MASK;

			// notify the client that the socket connected
			if (m_connect_handler)
			{
				m_connect_handler = false;
				utp_stream::on_connect(m_userdata, m_error, false);
			}
			BOOST_FALLTHROUGH;
		}
		// fall through
		case state_t::connected:
		{
			// the lowest seen RTT can be used to clamp the delay
			// within reasonable bounds. The one-way delay is never
			// higher than the round-trip time.

			if (sample && acked_bytes && prev_bytes_in_flight)
			{
				// only use the minimum from the last 3 delay measurements
				delay = *std::min_element(m_delay_sample_hist.begin()
					, m_delay_sample_hist.end());

				// it's impossible for delay to be more than the RTT, so make
				// sure to clamp it as a sanity check
				if (delay > min_rtt) delay = min_rtt;

				do_ledbat(acked_bytes, int(delay), prev_bytes_in_flight);
				m_send_delay = std::int32_t(delay);
			}

			m_recv_delay = std::int32_t(std::min(their_delay, min_rtt));

			consume_incoming_data(ph, ptr, payload_size, receive_time);

			// the parameter to send_pkt tells it if we're acking data
			// If we are, we'll send an ACK regardless of if we have any
			// space left in our send window or not. If we just got an ACK
			// (i.e. ST_STATE) we're not ACKing anything. If we just
			// received a FIN packet, we need to ack that as well
			bool const has_ack = ph->get_type() == ST_DATA
				|| ph->get_type() == ST_FIN
				|| ph->get_type() == ST_SYN;

			std::uint32_t prev_out_packets = m_out_packets;

			// the connection is connected and this packet made it past all the
			// checks. We can now assume the other end is not spoofing it's IP.
			if (ph->get_type() != ST_SYN) m_confirmed = true;

			// try to send more data as long as we can
			// if send_pkt returns true
			while (send_pkt());

			if (has_ack && prev_out_packets == m_out_packets)
			{
				// we need to ack some data we received, and we didn't
				// end up sending any payload packets in the loop
				// above (because m_out_packets would have been incremented
				// in that case). This means we need to send an ack.
				// don't do it right away, because we may still receive
				// more packets. defer the ack to send as few acks as possible
				defer_ack();
			}

			// we may want to call the user callback function at the end
			// of this round. Subscribe to that event
			subscribe_drained();

			if (state() == state_t::error_wait || state() == state_t::deleting) return true;

			// Everything up to the FIN has been received
			if (m_in_eof && m_ack_nr == ((m_in_eof_seq_nr - 1) & ACK_MASK))
			{
				UTP_LOGV("%8p: incoming stream at EOF\n", static_cast<void*>(this));
				if (state() == state_t::error_wait || state() == state_t::deleting) return true;
			}

			TORRENT_ASSERT(!compare_less_wrap(m_seq_nr, m_acked_seq_nr, ACK_MASK));

#if TORRENT_UTP_LOG
			if (sample && acked_bytes && prev_bytes_in_flight)
			{
				char their_delay_base[20];
				if (m_their_delay_hist.initialized())
					std::snprintf(their_delay_base, sizeof(their_delay_base), "%u", m_their_delay_hist.base());
				else
					strcpy(their_delay_base, "-");

				char our_delay_base[20];
				if (m_delay_hist.initialized())
					std::snprintf(our_delay_base, sizeof(our_delay_base), "%u", m_delay_hist.base());
				else
					strcpy(our_delay_base, "-");

				UTP_LOG("%8p: "
					"actual_delay:%u "
					"our_delay:%f "
					"their_delay:%f "
					"off_target:%f "
					"max_window:%u "
					"upload_rate:%d "
					"delay_base:%s "
					"delay_sum:%f "
					"target_delay:%d "
					"acked_bytes:%d "
					"cur_window:%d "
					"scaled_gain:%f "
					"rtt:%u "
					"rate:%d "
					"quota:%d "
					"wnduser:%u "
					"rto:%d "
					"timeout:%d "
					"get_microseconds:%u "
					"cur_window_packets:%u "
					"packet_size:%d "
					"their_delay_base:%s "
					"their_actual_delay:%u "
					"seq_nr:%u "
					"acked_seq_nr:%u "
					"reply_micro:%u "
					"min_rtt:%u "
					"send_buffer:%d "
					"recv_buffer:%d "
					"fast_resend_seq_nr:%d "
					"ssthres:%d "
					"\n"
					, static_cast<void*>(this)
					, sample
					, delay / 1000.0
					, their_delay / 1000.0
					, int(m_sm.target_delay() - delay) / 1000.0
					, std::uint32_t(m_cwnd >> 16)
					, 0
					, our_delay_base
					, (delay + their_delay) / 1000.0
					, m_sm.target_delay() / 1000
					, acked_bytes
					, m_bytes_in_flight
					, 0.0 // float(scaled_gain)
					, m_rtt.mean()
					, int((m_cwnd * 1000 / (m_rtt.mean()?m_rtt.mean():50)) >> 16)
					, 0
					, m_adv_wnd
					, packet_timeout()
					, int(total_milliseconds(m_timeout - receive_time))
					, int(total_microseconds(receive_time.time_since_epoch()))
					, m_outbuf.size()
					, m_mtu
					, their_delay_base
					, std::uint32_t(m_reply_micro)
					, m_seq_nr
					, m_acked_seq_nr
					, m_reply_micro
					, min_rtt / 1000
					, m_write_buffer_size
					, m_read_buffer_size
					, m_fast_resend_seq_nr
					, m_ssthres);
			}
#endif

			break;
		}
		case state_t::fin_sent:
		{
			// There are two ways we can end up in this state:
			//
			// 1. If the socket has been explicitly closed on our
			//    side, in which case m_in_eof is false.
			//
			// 2. If we received a FIN from the remote side, in which
			//    case m_in_eof is true. If this is the case, we don't
			//    come here until everything up to the FIN has been
			//    received.
			//
			//
			//

			// At this point m_seq_nr - 1 is the FIN sequence number.

			// We can receive both ST_DATA and ST_STATE here, because after
			// we have closed our end of the socket, the remote end might
			// have data in the pipeline. We don't really care about the
			// data, but we do have to ack it. Or rather, we have to ack
			// the FIN that will come after the data.

			// Case 1:
			// ---------------------------------------------------------------
			//
			// If we are here because the local endpoint was closed, we need
			// to first wait for all of our messages to be acked:
			//
			//   if (m_acked_seq_nr == ((m_seq_nr - 1) & ACK_MASK))
			//
			// `m_seq_nr - 1` is the ST_FIN message that we sent.
			//
			//                     ----------------------
			//
			// After that has happened we need to wait for the remote side
			// to send its ST_FIN message. When we receive that we send an
			// ST_STATE back to ack, and wait for a sufficient period.
			// During this wait we keep acking incoming ST_FIN's. This is
			// all handled at the top of this function.
			//
			// Note that the user handlers are all cancelled when the initial
			// close() call happens, so nothing will happen on the user side
			// after that.

			// Case 2:
			// ---------------------------------------------------------------
			//
			// If we are here because we received a ST_FIN message, and then
			// sent our own ST_FIN to ack that, we need to wait for our ST_FIN
			// to be acked:
			//
			//   if (m_acked_seq_nr == ((m_seq_nr - 1) & ACK_MASK))
			//
			// `m_seq_nr - 1` is the ST_FIN message that we sent.
			//
			// After that has happened we know the remote side has all our
			// data, and we can gracefully shut down.

			// we should still ack any incoming data to prevent potential
			// timeouts/resends at the other end
			if (ph->get_type() == ST_DATA) defer_ack();

			if (consume_incoming_data(ph, ptr, payload_size, receive_time))
			{
				break;
			}

			// we don't increment m_seq_nr when sending a FIN, so we actually
			// need to wait for m_acked_sen_nr to reach m_seq_nr before the FIN
			// is considered ACKed
			if (m_acked_seq_nr == m_seq_nr)
			{
				// When this happens we know that the remote side has
				// received all of our packets.

				UTP_LOGV("%8p: FIN acked\n", static_cast<void*>(this));

				if (!m_attached)
				{
					UTP_LOGV("%8p: close initiated here, delete socket\n"
						, static_cast<void*>(this));
					m_error = boost::asio::error::eof;
					set_state(state_t::deleting);
					test_socket_state();
				}
				else
				{
					UTP_LOGV("%8p: closing socket\n", static_cast<void*>(this));
					m_error = boost::asio::error::eof;
					set_state(state_t::error_wait);
					test_socket_state();
				}
			}

			break;
		}
		case state_t::deleting:
		case state_t::error_wait:
		{
			// respond with a reset
			send_reset(ph->seq_nr);
			break;
		}
	}
	return true;
}